

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_setfenv(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  StkId pTVar3;
  int iVar4;
  TValue *o1;
  ulong uVar5;
  Node *pNVar6;
  char *extramsg;
  int idx;
  Node *pNVar7;
  lua_Number lVar8;
  lua_Debug local_90;
  
  luaL_checktype(L,2,5);
  pTVar1 = L->top;
  pTVar2 = L->base;
  if ((pTVar2 != &luaO_nilobject_ && pTVar2 < pTVar1) && (pTVar2->tt == 6)) {
    pTVar1->value = pTVar2->value;
    pTVar1->tt = pTVar2->tt;
    pNVar6 = (Node *)(L->top + 1);
    L->top = (StkId)pNVar6;
LAB_0010a38c:
    pNVar7 = (Node *)&luaO_nilobject_;
    if ((Node *)(L->base + 1) < pNVar6) {
      pNVar7 = (Node *)(L->base + 1);
    }
    (pNVar6->i_val).value = (pNVar7->i_val).value;
    (pNVar6->i_val).tt = (pNVar7->i_val).tt;
    L->top = L->top + 1;
    idx = 1;
    iVar4 = lua_isnumber(L,1);
    if (iVar4 != 0) {
      idx = 1;
      lVar8 = lua_tonumber(L,1);
      if ((lVar8 == 0.0) && (!NAN(lVar8))) {
        pTVar3 = L->top;
        (pTVar3->value).gc = (GCObject *)L;
        pTVar3->tt = 8;
        L->top = L->top + 1;
        iVar4 = -2;
        lua_insert(L,-2);
        lua_setfenv(L,iVar4);
        return 0;
      }
    }
    if (((L->top[-2].tt != 6) || (((L->top[-2].value.gc)->h).flags == '\0')) &&
       (iVar4 = lua_setfenv(L,idx), iVar4 != 0)) {
      return 1;
    }
    luaL_error(L,"\'setfenv\' cannot change environment of given object");
  }
  uVar5 = luaL_checkinteger(L,1);
  if ((int)uVar5 < 0) {
    extramsg = "level must be non-negative";
  }
  else {
    iVar4 = lua_getstack(L,(int)uVar5,&local_90);
    if (iVar4 != 0) {
      lua_getinfo(L,"f",&local_90);
      pNVar6 = (Node *)L->top;
      if ((pNVar6 != &dummynode_) && (*(int *)((long)&pNVar6[-1].i_key + 0x10) == 0)) {
        luaL_error(L,"no function environment for tail call at level %d",uVar5 & 0xffffffff);
      }
      goto LAB_0010a38c;
    }
    extramsg = "invalid level";
  }
  luaL_argerror(L,1,extramsg);
}

Assistant:

static int luaB_setfenv(lua_State*L){
luaL_checktype(L,2,5);
getfunc(L,0);
lua_pushvalue(L,2);
if(lua_isnumber(L,1)&&lua_tonumber(L,1)==0){
lua_pushthread(L);
lua_insert(L,-2);
lua_setfenv(L,-2);
return 0;
}
else if(lua_iscfunction(L,-2)||lua_setfenv(L,-2)==0)
luaL_error(L,
LUA_QL("setfenv")" cannot change environment of given object");
return 1;
}